

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomFourAction::Go(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  string *this_01;
  itemType local_dc;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    local_dc = BALL;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_dc);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == WON) {
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,
                 "The walls have shifted around and revealed a door on the north wall that you now use, heading north."
                 ,(allocator *)&local_dc);
      ActionResults::ActionResults(this_00,B_ROOM5,&local_38);
      this_01 = &local_38;
      goto LAB_00120bc4;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    local_dc = ROPE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_dc);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != HIDDEN) {
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,
                 "You don\'t see anything to the north. Maybe you should explore these pillars a bit more."
                 ,(allocator *)&local_dc);
      ActionResults::ActionResults(this_00,CURRENT,&local_58);
      this_01 = &local_58;
      goto LAB_00120bc4;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == SOUTH) {
    this_00 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_78,"You head back to the strange icy room.",(allocator *)&local_dc);
    ActionResults::ActionResults(this_00,B_ROOM3,&local_78);
    this_01 = &local_78;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == EAST) {
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_98,"You can\'t go west, you can only go south...",
                 (allocator *)&local_dc);
      ActionResults::ActionResults(this_00,CURRENT,&local_98);
      this_01 = &local_98;
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      this_00 = (ActionResults *)operator_new(0x30);
      if (iVar1 == WEST) {
        std::__cxx11::string::string
                  ((string *)&local_b8,"You can\'t go west, you can only go south...",
                   (allocator *)&local_dc);
        ActionResults::ActionResults(this_00,CURRENT,&local_b8);
        this_01 = &local_b8;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_d8,"You can\'t go there.",(allocator *)&local_dc);
        ActionResults::ActionResults(this_00,CURRENT,&local_d8);
        this_01 = &local_d8;
      }
    }
  }
LAB_00120bc4:
  std::__cxx11::string::~string((string *)this_01);
  return this_00;
}

Assistant:

ActionResults *BlueRoomFourAction::Go() {

    if (commands->getMainItem() == NORTH && (itemList->getValue(BALL)->getLocation() == WON)) {
        return new ActionResults(B_ROOM5, "The walls have shifted around and revealed a door on the north wall that you now use, heading north.");
    }
    if (commands->getMainItem() == NORTH && (itemList->getValue(ROPE)->getLocation() != HIDDEN)) {
        return new ActionResults(CURRENT, "You don't see anything to the north. Maybe you should explore these pillars a bit more.");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(B_ROOM3, "You head back to the strange icy room.");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    return new ActionResults(CURRENT,"You can't go there.");

}